

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastzip.cpp
# Opt level: O0

PackResult
store_uncompressed(File *f,int inSize,uint8_t *out,size_t *outSize,uint32_t *checksum,uint8_t *sha)

{
  uint32_t uVar1;
  undefined1 local_a0 [8];
  SHA_CTX context;
  size_t size;
  uint8_t *sha_local;
  uint32_t *checksum_local;
  size_t *outSize_local;
  uint8_t *out_local;
  int inSize_local;
  File *f_local;
  
  context._88_8_ = File::Read<unsigned_char>(f,out,(long)inSize);
  if (sha != (uint8_t *)0x0) {
    SHA1_Init((SHA_CTX *)local_a0);
    SHA1_Update((SHA_CTX *)local_a0,out,context._88_8_);
    SHA1_Final(sha,(SHA_CTX *)local_a0);
  }
  if (checksum != (uint32_t *)0x0) {
    uVar1 = crc32_fast(out,context._88_8_,0);
    *checksum = uVar1;
  }
  *outSize = context._88_8_;
  return STORED;
}

Assistant:

static PackResult store_uncompressed(File& f, int inSize, uint8_t* out,
                                     size_t* outSize, uint32_t* checksum,
                                     uint8_t* sha)
{
    auto const size = f.Read(out, inSize);

    if (sha) {
        SHA_CTX context;
        SHA1_Init(&context);
        SHA1_Update(&context, out, size);
        SHA1_Final(sha, &context);
    }

    if (checksum) {
        *checksum = crc32_fast(out, size);
    }
    *outSize = size;

    return PackResult::STORED;
}